

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralPointReaction::IfcStructuralPointReaction
          (IfcStructuralPointReaction *this)

{
  IfcStructuralPointReaction *this_local;
  
  STEP::Object::Object
            ((Object *)&(this->super_IfcStructuralReaction).field_0x158,"IfcStructuralPointReaction"
            );
  IfcStructuralReaction::IfcStructuralReaction
            (&this->super_IfcStructuralReaction,&PTR_construction_vtable_24__00e86bb0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralPointReaction,_0UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralPointReaction,_0UL> *)
             &(this->super_IfcStructuralReaction).super_IfcStructuralActivity.field_0x148,
             &PTR_construction_vtable_24__00e86ce8);
  *(undefined8 *)
   &(this->super_IfcStructuralReaction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject
       = 0xe86a80;
  *(undefined8 *)&(this->super_IfcStructuralReaction).field_0x158 = 0xe86b98;
  *(undefined8 *)
   &(this->super_IfcStructuralReaction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject
    .field_0x88 = 0xe86aa8;
  (this->super_IfcStructuralReaction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0xe86ad0;
  *(undefined8 *)
   &(this->super_IfcStructuralReaction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject
    .field_0xd0 = 0xe86af8;
  *(undefined8 *)
   &(this->super_IfcStructuralReaction).super_IfcStructuralActivity.super_IfcProduct.field_0x100 =
       0xe86b20;
  *(undefined8 *)&(this->super_IfcStructuralReaction).super_IfcStructuralActivity.field_0x138 =
       0xe86b48;
  *(undefined8 *)&(this->super_IfcStructuralReaction).super_IfcStructuralActivity.field_0x148 =
       0xe86b70;
  return;
}

Assistant:

IfcStructuralPointReaction() : Object("IfcStructuralPointReaction") {}